

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O3

void do_accept(uv_timer_t *timer_handle)

{
  uv_loop_t *server;
  int iVar1;
  uv_tcp_t *tcp;
  void *pvVar2;
  undefined8 *extraout_RDX;
  code *in_RSI;
  uv_loop_t *loop;
  
  loop = (uv_loop_t *)0xf8;
  tcp = (uv_tcp_t *)malloc(0xf8);
  if (timer_handle == (uv_timer_t *)0x0) {
    do_accept_cold_4();
LAB_0014b677:
    do_accept_cold_3();
LAB_0014b67c:
    do_accept_cold_1();
  }
  else {
    if (tcp == (uv_tcp_t *)0x0) goto LAB_0014b677;
    loop = uv_default_loop();
    in_RSI = (code *)tcp;
    iVar1 = uv_tcp_init(loop,tcp);
    if (iVar1 != 0) goto LAB_0014b67c;
    server = (uv_loop_t *)timer_handle->data;
    in_RSI = (code *)tcp;
    loop = server;
    iVar1 = uv_accept((uv_stream_t *)server,(uv_stream_t *)tcp);
    if (iVar1 == 0) {
      do_accept_called = do_accept_called + 1;
      uv_close((uv_handle_t *)tcp,close_cb);
      if (do_accept_called == 2) {
        uv_close((uv_handle_t *)server,close_cb);
      }
      uv_close((uv_handle_t *)timer_handle,close_cb);
      return;
    }
  }
  do_accept_cold_2();
  if (loop != (uv_loop_t *)0x0) {
    free(loop);
    close_cb_called = close_cb_called + 1;
    return;
  }
  close_cb_cold_1();
  if (loop == (uv_loop_t *)0x0) {
    connect_cb_cold_3();
  }
  else if ((int)in_RSI == 0) {
    in_RSI = alloc_cb;
    iVar1 = uv_read_start((uv_stream_t *)loop->pending_queue[0],alloc_cb,read_cb);
    if (iVar1 == 0) {
      connect_cb_called = connect_cb_called + 1;
      free(loop);
      return;
    }
    goto LAB_0014b6df;
  }
  connect_cb_cold_1();
LAB_0014b6df:
  connect_cb_cold_2();
  pvVar2 = malloc((size_t)in_RSI);
  *extraout_RDX = pvVar2;
  extraout_RDX[1] = in_RSI;
  return;
}

Assistant:

static void do_accept(uv_timer_t* timer_handle) {
  uv_tcp_t* server;
  uv_tcp_t* accepted_handle = (uv_tcp_t*)malloc(sizeof *accepted_handle);
  int r;

  ASSERT(timer_handle != NULL);
  ASSERT(accepted_handle != NULL);

  r = uv_tcp_init(uv_default_loop(), accepted_handle);
  ASSERT(r == 0);

  server = (uv_tcp_t*)timer_handle->data;
  r = uv_accept((uv_stream_t*)server, (uv_stream_t*)accepted_handle);
  ASSERT(r == 0);

  do_accept_called++;

  /* Immediately close the accepted handle. */
  uv_close((uv_handle_t*)accepted_handle, close_cb);

  /* After accepting the two clients close the server handle */
  if (do_accept_called == 2) {
    uv_close((uv_handle_t*)server, close_cb);
  }

  /* Dispose the timer. */
  uv_close((uv_handle_t*)timer_handle, close_cb);
}